

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.hpp
# Opt level: O3

IntermediateData rest_rpc::MD5::MD5CE::ProcessMessage(char *message,uint32_t n)

{
  undefined8 uVar1;
  uint m;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  uint32_t i_00;
  uint32_t i;
  uint32_t i_01;
  uint uVar6;
  ulong uVar7;
  IntermediateData IVar8;
  RoundData data;
  IntermediateData local_98;
  char *local_88;
  undefined8 local_80;
  ulong local_78;
  RoundData local_70;
  
  local_80 = CONCAT44(in_register_00000034,n);
  uVar3 = 0x1032547698badcfe;
  m = n + 0x48 & 0xffffffc0;
  if (m == 0) {
    uVar1 = 0xefcdab8967452301;
  }
  else {
    uVar7 = 0xefcdab89;
    uVar5 = 0x67452301;
    i_00 = 0;
    local_88 = message;
    do {
      GetRoundData(&local_70,local_88,(uint32_t)local_80,m,i_00);
      uVar2 = uVar5 | uVar7 << 0x20;
      local_98.c = (int)uVar3;
      local_98.d = (int)(uVar3 >> 0x20);
      local_98.a = (int)uVar2;
      local_98.b = (int)(uVar2 >> 0x20);
      i_01 = 0;
      local_78 = uVar7;
      do {
        local_98 = ApplyStep(i_01,&local_70,&local_98);
        i_01 = i_01 + 1;
      } while (i_01 != 0x40);
      uVar4 = (int)uVar5 + local_98.a;
      uVar5 = (ulong)uVar4;
      uVar6 = (int)local_78 + local_98.b;
      uVar7 = (ulong)uVar6;
      uVar3 = (ulong)((int)uVar3 + local_98.c) |
              (local_98._8_8_ & 0xffffffff00000000) + uVar3 & 0xffffffff00000000;
      i_00 = i_00 + 0x40;
    } while (i_00 < m);
    uVar1 = CONCAT44(uVar6,uVar4);
  }
  IVar8.c = (int)uVar3;
  IVar8.d = (int)(uVar3 >> 0x20);
  IVar8.a = (int)uVar1;
  IVar8.b = (int)((ulong)uVar1 >> 0x20);
  return IVar8;
}

Assistant:

static IntermediateData ProcessMessage(const char *message,
                                         const uint32_t n) {
    const uint32_t m = GetPaddedMessageLength(n);
    IntermediateData intermediate0 = kInitialIntermediateData;
    for (uint32_t offset = 0; offset < m; offset += 64) {
      RoundData data = GetRoundData(message, n, m, offset);
      IntermediateData intermediate1 = intermediate0;
      for (uint32_t i = 0; i < 64; ++i)
        intermediate1 = ApplyStep(i, data, intermediate1);
      intermediate0 = Add(intermediate0, intermediate1);
    }
    return intermediate0;
  }